

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O2

void GotoMission(int id)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  int ival;
  long local_140;
  char line [256];
  
  ival = 0;
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  if (missionfile == (FILE *)0x0 && bMissionRunning == 0) {
    pcVar4 = "Cannot use goto outside a mission file.";
LAB_0012e5fc:
    puts(pcVar4);
    pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
    return;
  }
  if (0x3ff < (uint)id) {
    pcVar4 = "Invalid parameter.";
    goto LAB_0012e5fc;
  }
  if (labels[(uint)id] < 1) {
    local_140 = ftell((FILE *)missionfile);
    rewind((FILE *)missionfile);
    iVar1 = 2;
    while( true ) {
      pcVar4 = fgets(line,0x100,(FILE *)missionfile);
      if (pcVar4 == (char *)0x0) break;
      iVar2 = __isoc99_sscanf(line,"label %d",&ival);
      if (iVar2 == 1) {
        uVar3 = (ulong)(uint)ival;
        if (uVar3 < 0x400) {
          if (labels[uVar3] < 1) {
            labels[uVar3] = iVar1;
            if (ival == id) goto LAB_0012e712;
          }
          else if (iVar1 != labels[uVar3]) {
            printf("Label %d already exists.\n");
          }
        }
        else {
          puts("Invalid parameter.");
        }
      }
      iVar1 = iVar1 + 1;
    }
    puts("goto failed : label not found.");
    clearerr((FILE *)missionfile);
    iVar1 = fseek((FILE *)missionfile,(long)(int)local_140,0);
    if (iVar1 == 0) goto LAB_0012e712;
    pcVar4 = "File error.";
  }
  else {
    iVar1 = fsetline(missionfile,labels[(uint)id]);
    if (iVar1 == 0) goto LAB_0012e712;
    pcVar4 = "goto failed.";
  }
  puts(pcVar4);
LAB_0012e712:
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  return;
}

Assistant:

inline void GotoMission(int id)
{
	int cur = 0, i = 0, ival = 0;
	char* r = NULL;
	char line[MAX_BUF_LEN];

	EnterCriticalSection(&MissionFilesCS);
	if ((!bMissionRunning)&&(!missionfile))
	{
		printf("Cannot use goto outside a mission file.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if ((id < 0)||(id >= MAX_NB_LABELS))
	{
		printf("Invalid parameter.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if (labels[id] > 0) 
	{
		// Go to the next line after the label.
		if (fsetline(missionfile, labels[id]) != EXIT_SUCCESS)
		{
			printf("goto failed.\n");
		}
	}
	else
	{
		// Need to search for the label.

		cur = ftell(missionfile);
		rewind(missionfile);

		for (;;)
		{
			r = fgets(line, sizeof(line), missionfile);
			if (r == NULL) 
			{
				printf("goto failed : label not found.\n");
				clearerr(missionfile);
				// Go back to initial position.
				if (fseek(missionfile, cur, SEEK_SET) != EXIT_SUCCESS)
				{
					printf("File error.\n");
				}
				break;
			}
			i++;
			if (sscanf(line, "label %d", &ival) == 1)
			{
				if ((ival < 0)||(ival >= MAX_NB_LABELS))
				{
					printf("Invalid parameter.\n");
					continue;
				}
				if (labels[ival] > 0) 
				{
					if (labels[ival] != i+1)
					{
						printf("Label %d already exists.\n", ival);
						continue;
					}
				}
				else 
				{
					labels[ival] = i+1;
					if (ival == id) break;
				}
			}
		}
	}
	LeaveCriticalSection(&MissionFilesCS);
}